

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xml_parse_status
pugi::impl::anon_unknown_0::load_stream_data_noseek<wchar_t>
          (basic_istream<wchar_t,_std::char_traits<wchar_t>_> *stream,void **out_buffer,
          size_t *out_size)

{
  xml_stream_chunk<wchar_t> *pxVar1;
  byte bVar2;
  long lVar3;
  xml_stream_chunk<wchar_t> *pxVar4;
  undefined8 *local_88;
  xml_stream_chunk<wchar_t> *chunk_1;
  char *write;
  char *buffer;
  size_t max_suffix_size;
  xml_stream_chunk<wchar_t> *chunk;
  xml_stream_chunk<wchar_t> *local_48;
  xml_stream_chunk<wchar_t> *last;
  size_t total;
  auto_deleter<pugi::impl::(anonymous_namespace)::xml_stream_chunk<wchar_t>_> chunks;
  size_t *out_size_local;
  void **out_buffer_local;
  basic_istream<wchar_t,_std::char_traits<wchar_t>_> *stream_local;
  
  chunks.deleter = (D)out_size;
  auto_deleter<pugi::impl::(anonymous_namespace)::xml_stream_chunk<wchar_t>_>::auto_deleter
            ((auto_deleter<pugi::impl::(anonymous_namespace)::xml_stream_chunk<wchar_t>_> *)&total,
             (xml_stream_chunk<wchar_t> *)0x0,xml_stream_chunk<wchar_t>::destroy);
  last = (xml_stream_chunk<wchar_t> *)0x0;
  local_48 = (xml_stream_chunk<wchar_t> *)0x0;
  do {
    bVar2 = std::wios::eof();
    if (((bVar2 ^ 0xff) & 1) == 0) {
      pxVar4 = (xml_stream_chunk<wchar_t> *)
               (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                         allocate)((undefined1 *)((long)&last->next + 1));
      if (pxVar4 == (xml_stream_chunk<wchar_t> *)0x0) {
        stream_local._4_4_ = status_out_of_memory;
      }
      else {
        chunk_1 = pxVar4;
        for (local_88 = (undefined8 *)total; local_88 != (undefined8 *)0x0;
            local_88 = (undefined8 *)*local_88) {
          if ((ulong)((long)last->data + (long)(pxVar4->data + -8)) <
              (ulong)((long)chunk_1->data + local_88[1] + -0x10)) {
            __assert_fail("write + chunk->size <= buffer + total",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                          ,0x1321,
                          "xml_parse_status pugi::impl::(anonymous namespace)::load_stream_data_noseek(std::basic_istream<T> &, void **, size_t *) [T = wchar_t]"
                         );
          }
          memcpy(chunk_1,local_88 + 2,local_88[1]);
          chunk_1 = (xml_stream_chunk<wchar_t> *)((long)chunk_1->data + local_88[1] + -0x10);
        }
        if (chunk_1 != (xml_stream_chunk<wchar_t> *)((long)last->data + (long)(pxVar4->data + -8)))
        {
          __assert_fail("write == buffer + total",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                        ,0x1326,
                        "xml_parse_status pugi::impl::(anonymous namespace)::load_stream_data_noseek(std::basic_istream<T> &, void **, size_t *) [T = wchar_t]"
                       );
        }
        *out_buffer = pxVar4;
        *(xml_stream_chunk<wchar_t> **)chunks.deleter = last;
        stream_local._4_4_ = status_ok;
      }
LAB_0012b53e:
      auto_deleter<pugi::impl::(anonymous_namespace)::xml_stream_chunk<wchar_t>_>::~auto_deleter
                ((auto_deleter<pugi::impl::(anonymous_namespace)::xml_stream_chunk<wchar_t>_> *)
                 &total);
      return stream_local._4_4_;
    }
    pxVar4 = xml_stream_chunk<wchar_t>::create();
    if (pxVar4 == (xml_stream_chunk<wchar_t> *)0x0) {
      stream_local._4_4_ = status_out_of_memory;
      goto LAB_0012b53e;
    }
    pxVar1 = pxVar4;
    if (local_48 != (xml_stream_chunk<wchar_t> *)0x0) {
      local_48->next = pxVar4;
      pxVar1 = (xml_stream_chunk<wchar_t> *)total;
    }
    total = (size_t)pxVar1;
    std::wistream::read((wchar_t *)stream,(long)pxVar4->data);
    lVar3 = std::wistream::gcount();
    pxVar4->size = lVar3 << 2;
    bVar2 = std::wios::bad();
    if (((bVar2 & 1) != 0) ||
       ((bVar2 = std::wios::eof(), (bVar2 & 1) == 0 && (bVar2 = std::wios::fail(), (bVar2 & 1) != 0)
        ))) {
      stream_local._4_4_ = status_io_error;
      goto LAB_0012b53e;
    }
    if ((xml_stream_chunk<wchar_t> *)((long)last->data + (pxVar4->size - 0x10)) < last) {
      stream_local._4_4_ = status_out_of_memory;
      goto LAB_0012b53e;
    }
    last = (xml_stream_chunk<wchar_t> *)((long)last->data + (pxVar4->size - 0x10));
    local_48 = pxVar4;
  } while( true );
}

Assistant:

PUGI__FN xml_parse_status load_stream_data_noseek(std::basic_istream<T>& stream, void** out_buffer, size_t* out_size)
	{
		auto_deleter<xml_stream_chunk<T> > chunks(0, xml_stream_chunk<T>::destroy);

		// read file to a chunk list
		size_t total = 0;
		xml_stream_chunk<T>* last = 0;

		while (!stream.eof())
		{
			// allocate new chunk
			xml_stream_chunk<T>* chunk = xml_stream_chunk<T>::create();
			if (!chunk) return status_out_of_memory;

			// append chunk to list
			if (last) last = last->next = chunk;
			else chunks.data = last = chunk;

			// read data to chunk
			stream.read(chunk->data, static_cast<std::streamsize>(sizeof(chunk->data) / sizeof(T)));
			chunk->size = static_cast<size_t>(stream.gcount()) * sizeof(T);

			// read may set failbit | eofbit in case gcount() is less than read length, so check for other I/O errors
			if (stream.bad() || (!stream.eof() && stream.fail())) return status_io_error;

			// guard against huge files (chunk size is small enough to make this overflow check work)
			if (total + chunk->size < total) return status_out_of_memory;
			total += chunk->size;
		}

		size_t max_suffix_size = sizeof(char_t);

		// copy chunk list to a contiguous buffer
		char* buffer = static_cast<char*>(xml_memory::allocate(total + max_suffix_size));
		if (!buffer) return status_out_of_memory;

		char* write = buffer;

		for (xml_stream_chunk<T>* chunk = chunks.data; chunk; chunk = chunk->next)
		{
			assert(write + chunk->size <= buffer + total);
			memcpy(write, chunk->data, chunk->size);
			write += chunk->size;
		}

		assert(write == buffer + total);

		// return buffer
		*out_buffer = buffer;
		*out_size = total;

		return status_ok;
	}